

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

void * __thiscall QGuiApplication::resolveInterface(QGuiApplication *this,char *name,int revision)

{
  QDebug QVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer_____offset_0x10___ *ppuVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  Stream *local_70;
  QDebug local_68;
  char local_60 [24];
  undefined8 local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = QtPrivateLogging::lcNativeInterface();
  if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
    local_48 = *(undefined8 *)(lVar3 + 8);
    local_60[0] = '\x02';
    local_60[1] = '\0';
    local_60[2] = '\0';
    local_60[3] = '\0';
    local_60[4] = '\0';
    local_60[5] = '\0';
    local_60[6] = '\0';
    local_60[7] = '\0';
    local_60[8] = '\0';
    local_60[9] = '\0';
    local_60[10] = '\0';
    local_60[0xb] = '\0';
    local_60[0xc] = '\0';
    local_60[0xd] = '\0';
    local_60[0xe] = '\0';
    local_60[0xf] = '\0';
    local_60[0x10] = '\0';
    local_60[0x11] = '\0';
    local_60[0x12] = '\0';
    local_60[0x13] = '\0';
    local_60[0x14] = '\0';
    local_60[0x15] = '\0';
    local_60[0x16] = '\0';
    local_60[0x17] = '\0';
    QMessageLogger::debug
              (local_60,"Comparing requested interface name %s with available %s",name,
               "QX11Application");
  }
  iVar2 = qstrcmp(name,"QX11Application");
  lVar3 = QtPrivateLogging::lcNativeInterface();
  if (iVar2 == 0) {
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug
                (local_60,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar3 = QtPrivateLogging::lcNativeInterface();
    if (revision != 1) goto LAB_002dbb7a;
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug();
      QVar1.stream = local_78.stream;
      QVar6.m_data = (storage_type *)0x25;
      QVar6.m_size = (qsizetype)&local_40;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(&(QVar1.stream)->ts,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_78.stream)->space == true) {
        QTextStream::operator<<(&(local_78.stream)->ts,' ');
      }
      local_70 = local_78.stream;
      (local_78.stream)->ref = (local_78.stream)->ref + 1;
      if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
        (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x12])();
      }
      ::operator<<((QDebug *)&local_68,(QObject *)&local_70);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug((QDebug *)&local_70);
      QDebug::~QDebug(&local_78);
    }
    if (QGuiApplicationPrivate::platform_integration == (QPlatformIntegration *)0x0) {
      lVar3 = 0;
    }
    else {
      iVar2 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x12])();
      lVar3 = CONCAT44(extraout_var,iVar2);
    }
    if (lVar3 != 0) {
      ppuVar5 = &QNativeInterface::QX11Application::typeinfo;
      goto LAB_002dbc52;
    }
  }
  else {
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug(local_60,"No match for requested interface name %s",name);
    }
    lVar3 = QtPrivateLogging::lcNativeInterface();
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug
                (local_60,"Comparing requested interface name %s with available %s",name,
                 "QWaylandApplication");
    }
    iVar2 = qstrcmp(name,"QWaylandApplication");
    lVar3 = QtPrivateLogging::lcNativeInterface();
    if (iVar2 != 0) {
      if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
        local_48 = *(undefined8 *)(lVar3 + 8);
        local_60[0] = '\x02';
        local_60[1] = '\0';
        local_60[2] = '\0';
        local_60[3] = '\0';
        local_60[4] = '\0';
        local_60[5] = '\0';
        local_60[6] = '\0';
        local_60[7] = '\0';
        local_60[8] = '\0';
        local_60[9] = '\0';
        local_60[10] = '\0';
        local_60[0xb] = '\0';
        local_60[0xc] = '\0';
        local_60[0xd] = '\0';
        local_60[0xe] = '\0';
        local_60[0xf] = '\0';
        local_60[0x10] = '\0';
        local_60[0x11] = '\0';
        local_60[0x12] = '\0';
        local_60[0x13] = '\0';
        local_60[0x14] = '\0';
        local_60[0x15] = '\0';
        local_60[0x16] = '\0';
        local_60[0x17] = '\0';
        QMessageLogger::debug(local_60,"No match for requested interface name %s",name);
      }
      pvVar4 = (void *)QCoreApplication::resolveInterface((char *)this,(int)name);
      goto LAB_002dbc64;
    }
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug
                (local_60,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar3 = QtPrivateLogging::lcNativeInterface();
    if (revision == 1) {
      if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
        local_48 = *(undefined8 *)(lVar3 + 8);
        local_60[0] = '\x02';
        local_60[1] = '\0';
        local_60[2] = '\0';
        local_60[3] = '\0';
        local_60[4] = '\0';
        local_60[5] = '\0';
        local_60[6] = '\0';
        local_60[7] = '\0';
        local_60[8] = '\0';
        local_60[9] = '\0';
        local_60[10] = '\0';
        local_60[0xb] = '\0';
        local_60[0xc] = '\0';
        local_60[0xd] = '\0';
        local_60[0xe] = '\0';
        local_60[0xf] = '\0';
        local_60[0x10] = '\0';
        local_60[0x11] = '\0';
        local_60[0x12] = '\0';
        local_60[0x13] = '\0';
        local_60[0x14] = '\0';
        local_60[0x15] = '\0';
        local_60[0x16] = '\0';
        local_60[0x17] = '\0';
        QMessageLogger::debug();
        QVar1.stream = local_78.stream;
        QVar7.m_data = (storage_type *)0x25;
        QVar7.m_size = (qsizetype)&local_40;
        QString::fromUtf8(QVar7);
        QTextStream::operator<<(&(QVar1.stream)->ts,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_78.stream)->space == true) {
          QTextStream::operator<<(&(local_78.stream)->ts,' ');
        }
        local_88.stream = local_78.stream;
        (local_78.stream)->ref = (local_78.stream)->ref + 1;
        if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
          (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x12])();
        }
        ::operator<<((QDebug *)&local_80,(QObject *)&local_88);
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug(&local_78);
      }
      if (QGuiApplicationPrivate::platform_integration == (QPlatformIntegration *)0x0) {
        lVar3 = 0;
      }
      else {
        iVar2 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x12])();
        lVar3 = CONCAT44(extraout_var_00,iVar2);
      }
      if (lVar3 == 0) goto LAB_002dbb86;
      ppuVar5 = &QNativeInterface::QWaylandApplication::typeinfo;
LAB_002dbc52:
      pvVar4 = (void *)__dynamic_cast(lVar3,&QPlatformNativeInterface::typeinfo,ppuVar5,
                                      0xfffffffffffffffe);
      goto LAB_002dbc64;
    }
LAB_002dbb7a:
    if ((*(byte *)(lVar3 + 0x11) & 1) != 0) {
      local_48 = *(undefined8 *)(lVar3 + 8);
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      pvVar4 = (void *)0x0;
      QMessageLogger::warning
                (local_60,
                 "Native interface revision mismatch (requested %d / available %d) for interface %s"
                 ,(ulong)(uint)revision,1,name);
      goto LAB_002dbc64;
    }
  }
LAB_002dbb86:
  pvVar4 = (void *)0x0;
LAB_002dbc64:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pvVar4;
}

Assistant:

void *QGuiApplication::resolveInterface(const char *name, int revision) const
{
    using namespace QNativeInterface;
    using namespace QNativeInterface::Private;

    auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    Q_UNUSED(platformIntegration);

#if defined(Q_OS_WIN)
    QT_NATIVE_INTERFACE_RETURN_IF(QWindowsApplication, platformIntegration);
#endif
#if QT_CONFIG(xcb)
    QT_NATIVE_INTERFACE_RETURN_IF(QX11Application, platformNativeInterface());
#endif
#if QT_CONFIG(wayland)
    QT_NATIVE_INTERFACE_RETURN_IF(QWaylandApplication, platformNativeInterface());
#endif
#if defined(Q_OS_VISIONOS)
    QT_NATIVE_INTERFACE_RETURN_IF(QVisionOSApplication, platformIntegration);
#endif

    return QCoreApplication::resolveInterface(name, revision);
}